

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_compressBlock_lazy2_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  uint uVar1;
  uint uVar2;
  uint windowLog_00;
  BYTE *base_00;
  BYTE *pBVar3;
  int iVar4;
  int iVar5;
  U32 UVar6;
  U32 UVar7;
  uint uVar8;
  BYTE *iEnd;
  BYTE *iLimit;
  BYTE *iStart;
  BYTE *pBVar9;
  size_t sVar10;
  BYTE *pBVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  BYTE *dst;
  bool bVar15;
  BYTE *local_3e8;
  BYTE *local_3d8;
  BYTE *local_3c8;
  BYTE *local_3c0;
  BYTE *local_3a0;
  BYTE *local_390;
  BYTE *local_370;
  BYTE *local_360;
  BYTE *local_358;
  BYTE *local_348;
  U32 local_33c;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  BYTE *repEnd_3;
  BYTE *repMatch_3;
  BYTE *repBase_3;
  U32 repIndex_3;
  U32 windowLow_3;
  U32 repCurrent;
  size_t litLength;
  BYTE *mStart;
  BYTE *match;
  U32 matchIndex;
  int gain1_3;
  int gain2_3;
  size_t ml2_2;
  size_t offset2_1;
  int gain1_2;
  int gain2_2;
  size_t repLength_1;
  BYTE *repEnd_2;
  BYTE *repMatch_2;
  BYTE *repBase_2;
  U32 repIndex_2;
  U32 windowLow_2;
  int gain1_1;
  int gain2_1;
  size_t ml2_1;
  size_t offset2;
  int gain1;
  int gain2;
  size_t repLength;
  BYTE *repEnd_1;
  BYTE *repMatch_1;
  BYTE *repBase_1;
  U32 repIndex_1;
  U32 windowLow_1;
  size_t ml2;
  size_t offsetFound;
  BYTE *repEnd;
  BYTE *repMatch;
  BYTE *repBase;
  U32 local_1e8;
  U32 repIndex;
  U32 windowLow;
  U32 curr;
  BYTE *start;
  size_t offset;
  size_t matchLength;
  U32 offset_2;
  U32 offset_1;
  searchMax_f searchMax;
  searchMax_f searchFuncs [3];
  U32 rowLog;
  U32 windowLog;
  BYTE *dictStart;
  BYTE *dictEnd;
  BYTE *dictBase;
  BYTE *prefixStart;
  U32 dictLimit;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  
  iEnd = (BYTE *)((long)src + srcSize);
  iLimit = iEnd + -0x10;
  base_00 = (ms->window).base;
  uVar1 = (ms->window).dictLimit;
  iStart = base_00 + uVar1;
  pBVar3 = (ms->window).dictBase;
  pBVar9 = pBVar3 + uVar1;
  uVar2 = (ms->window).lowLimit;
  windowLog_00 = (ms->cParams).windowLog;
  UVar6 = 5;
  if ((ms->cParams).searchLog < 5) {
    UVar6 = 4;
  }
  searchMax = ZSTD_HcFindBestMatch_extDict_selectMLS;
  searchFuncs[0] = ZSTD_BtFindBestMatch_extDict_selectMLS;
  searchFuncs[1] = ZSTD_RowFindBestMatch_extDict_selectRowLog;
  _offset_2 = ZSTD_RowFindBestMatch_extDict_selectRowLog;
  matchLength._4_4_ = *rep;
  matchLength._0_4_ = rep[1];
  anchor = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == iStart));
  if ((ms->cParams).minMatch < 6) {
    local_33c = (ms->cParams).minMatch;
  }
  else {
    local_33c = 6;
  }
  ZSTD_row_fillHashCache(ms,base_00,UVar6,local_33c,ms->nextToUpdate,iLimit);
  iend = (BYTE *)src;
  do {
    while( true ) {
      if (iLimit <= anchor) {
        *rep = matchLength._4_4_;
        rep[1] = (U32)matchLength;
        return (long)iEnd - (long)iend;
      }
      offset = 0;
      start = (BYTE *)0x0;
      _windowLow = anchor + 1;
      iVar4 = (int)base_00;
      repIndex = (int)anchor - iVar4;
      local_1e8 = ZSTD_getLowestMatchIndex(ms,repIndex + 1,windowLog_00);
      repBase._4_4_ = (repIndex + 1) - matchLength._4_4_;
      local_348 = base_00;
      if (repBase._4_4_ < uVar1) {
        local_348 = pBVar3;
      }
      repMatch = local_348;
      repEnd = local_348 + repBase._4_4_;
      if (2 < (uVar1 - 1) - repBase._4_4_ && matchLength._4_4_ < (repIndex + 1) - local_1e8) {
        UVar6 = MEM_read32(anchor + 1);
        UVar7 = MEM_read32(repEnd);
        if (UVar6 == UVar7) {
          local_358 = iEnd;
          if (repBase._4_4_ < uVar1) {
            local_358 = pBVar9;
          }
          offsetFound = (size_t)local_358;
          sVar10 = ZSTD_count_2segments(anchor + 5,repEnd + 4,iEnd,local_358,iStart);
          offset = sVar10 + 4;
        }
      }
      ml2 = 999999999;
      _repIndex_1 = (*_offset_2)(ms,anchor,iEnd,&ml2);
      if (offset < _repIndex_1) {
        _windowLow = anchor;
        start = (BYTE *)ml2;
        offset = _repIndex_1;
      }
      if (3 < offset) break;
      anchor = anchor + ((long)anchor - (long)iend >> 8) + 1;
    }
    while (anchor < iLimit) {
      pBVar11 = anchor + 1;
      repIndex = repIndex + 1;
      if (start != (BYTE *)0x0) {
        repBase_1._4_4_ = ZSTD_getLowestMatchIndex(ms,repIndex,windowLog_00);
        repBase_1._0_4_ = repIndex - matchLength._4_4_;
        local_360 = base_00;
        if ((uint)repBase_1 < uVar1) {
          local_360 = pBVar3;
        }
        repMatch_1 = local_360;
        repEnd_1 = local_360 + (uint)repBase_1;
        if (2 < (uVar1 - 1) - (uint)repBase_1 && matchLength._4_4_ < repIndex - repBase_1._4_4_) {
          UVar6 = MEM_read32(pBVar11);
          UVar7 = MEM_read32(repEnd_1);
          if (UVar6 == UVar7) {
            local_370 = iEnd;
            if ((uint)repBase_1 < uVar1) {
              local_370 = pBVar9;
            }
            repLength = (size_t)local_370;
            sVar10 = ZSTD_count_2segments(anchor + 5,repEnd_1 + 4,iEnd,local_370,iStart);
            _gain1 = sVar10 + 4;
            offset2._4_4_ = (int)_gain1 * 3;
            iVar5 = (int)offset;
            UVar6 = ZSTD_highbit32((int)start + 1);
            offset2._0_4_ = (iVar5 * 3 - UVar6) + 1;
            if ((3 < _gain1) && ((int)offset2 < offset2._4_4_)) {
              offset = _gain1;
              start = (BYTE *)0x0;
              _windowLow = pBVar11;
            }
          }
        }
      }
      ml2_1 = 999999999;
      _gain1_1 = (*_offset_2)(ms,pBVar11,iEnd,&ml2_1);
      lVar12 = _gain1_1 << 2;
      UVar6 = ZSTD_highbit32((int)ml2_1 + 1);
      windowLow_2 = (int)lVar12 - UVar6;
      lVar12 = offset << 2;
      UVar6 = ZSTD_highbit32((int)start + 1);
      repIndex_2 = ((int)lVar12 - UVar6) + 4;
      if ((_gain1_1 < 4) || ((int)windowLow_2 <= (int)repIndex_2)) {
        if (iLimit <= pBVar11) break;
        pBVar11 = anchor + 2;
        repIndex = repIndex + 1;
        if (start != (BYTE *)0x0) {
          repBase_2._4_4_ = ZSTD_getLowestMatchIndex(ms,repIndex,windowLog_00);
          repBase_2._0_4_ = repIndex - matchLength._4_4_;
          local_390 = base_00;
          if ((uint)repBase_2 < uVar1) {
            local_390 = pBVar3;
          }
          repMatch_2 = local_390;
          repEnd_2 = local_390 + (uint)repBase_2;
          if (2 < (uVar1 - 1) - (uint)repBase_2 && matchLength._4_4_ < repIndex - repBase_2._4_4_) {
            UVar6 = MEM_read32(pBVar11);
            UVar7 = MEM_read32(repEnd_2);
            if (UVar6 == UVar7) {
              local_3a0 = iEnd;
              if ((uint)repBase_2 < uVar1) {
                local_3a0 = pBVar9;
              }
              repLength_1 = (size_t)local_3a0;
              sVar10 = ZSTD_count_2segments(anchor + 6,repEnd_2 + 4,iEnd,local_3a0,iStart);
              _gain1_2 = sVar10 + 4;
              offset2_1._4_4_ = (int)_gain1_2 * 4;
              lVar12 = offset << 2;
              UVar6 = ZSTD_highbit32((int)start + 1);
              offset2_1._0_4_ = ((int)lVar12 - UVar6) + 1;
              if ((3 < _gain1_2) && ((int)offset2_1 < offset2_1._4_4_)) {
                offset = _gain1_2;
                start = (BYTE *)0x0;
                _windowLow = pBVar11;
              }
            }
          }
        }
        ml2_2 = 999999999;
        uVar13 = (*_offset_2)(ms,pBVar11,iEnd,&ml2_2);
        UVar6 = ZSTD_highbit32((int)ml2_2 + 1);
        lVar12 = offset << 2;
        UVar7 = ZSTD_highbit32((int)start + 1);
        if ((uVar13 < 4) || ((int)((int)(uVar13 << 2) - UVar6) <= (int)(((int)lVar12 - UVar7) + 7)))
        break;
        start = (BYTE *)ml2_2;
        _windowLow = pBVar11;
        offset = uVar13;
        anchor = pBVar11;
      }
      else {
        start = (BYTE *)ml2_1;
        _windowLow = pBVar11;
        offset = _gain1_1;
        anchor = pBVar11;
      }
    }
    iVar5 = (int)start;
    if (start != (BYTE *)0x0) {
      uVar8 = ((int)_windowLow - iVar4) - (iVar5 + -2);
      if (uVar8 < uVar1) {
        local_3c0 = pBVar3 + uVar8;
      }
      else {
        local_3c0 = base_00 + uVar8;
      }
      mStart = local_3c0;
      local_3c8 = iStart;
      if (uVar8 < uVar1) {
        local_3c8 = pBVar3 + uVar2;
      }
      while( true ) {
        bVar15 = false;
        if ((iend < _windowLow) && (bVar15 = false, local_3c8 < mStart)) {
          bVar15 = _windowLow[-1] == mStart[-1];
        }
        if (!bVar15) break;
        _windowLow = _windowLow + -1;
        mStart = mStart + -1;
        offset = offset + 1;
      }
      matchLength._0_4_ = matchLength._4_4_;
      matchLength._4_4_ = iVar5 - 2;
    }
    uVar13 = (long)_windowLow - (long)iend;
    uVar14 = offset - 3;
    if (iEnd + -0x20 < iend + uVar13) {
      ZSTD_safecopyLiterals(seqStore->lit,iend,iend + uVar13,iEnd + -0x20);
    }
    else {
      ZSTD_copy16(seqStore->lit,iend);
      if (0x10 < uVar13) {
        pBVar11 = seqStore->lit;
        dst = pBVar11 + 0x10;
        ZSTD_copy16(dst,iend + 0x10);
        if (0x10 < (long)(uVar13 - 0x10)) {
          oend = pBVar11 + 0x20;
          do {
            op = iend + 0x20;
            ZSTD_copy16(oend,op);
            ZSTD_copy16(oend + 0x10,iend + 0x30);
            oend = oend + 0x20;
            iend = op;
          } while (oend < dst + (uVar13 - 0x10));
        }
      }
    }
    seqStore->lit = seqStore->lit + uVar13;
    if (0xffff < uVar13) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
    }
    seqStore->sequences->litLength = (U16)uVar13;
    seqStore->sequences->offset = iVar5 + 1;
    if (0xffff < uVar14) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos =
           (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
    }
    seqStore->sequences->matchLength = (U16)uVar14;
    seqStore->sequences = seqStore->sequences + 1;
    for (anchor = _windowLow + offset; iend = anchor, anchor <= iLimit; anchor = anchor + offset) {
      UVar6 = (int)anchor - iVar4;
      UVar7 = ZSTD_getLowestMatchIndex(ms,UVar6,windowLog_00);
      uVar8 = UVar6 - (U32)matchLength;
      local_3d8 = base_00;
      if (uVar8 < uVar1) {
        local_3d8 = pBVar3;
      }
      if ((uVar1 - 1) - uVar8 < 3 || UVar6 - UVar7 <= (U32)matchLength) break;
      UVar6 = MEM_read32(anchor);
      UVar7 = MEM_read32(local_3d8 + uVar8);
      if (UVar6 != UVar7) break;
      local_3e8 = iEnd;
      if (uVar8 < uVar1) {
        local_3e8 = pBVar9;
      }
      sVar10 = ZSTD_count_2segments(anchor + 4,local_3d8 + uVar8 + 4,iEnd,local_3e8,iStart);
      uVar8 = (U32)matchLength;
      offset = sVar10 + 4;
      start = (BYTE *)(ulong)(U32)matchLength;
      matchLength._0_4_ = matchLength._4_4_;
      matchLength._4_4_ = uVar8;
      if (iEnd + -0x20 < anchor) {
        ZSTD_safecopyLiterals(seqStore->lit,anchor,anchor,iEnd + -0x20);
      }
      else {
        ZSTD_copy16(seqStore->lit,anchor);
      }
      seqStore->lit = seqStore->lit;
      seqStore->sequences->litLength = 0;
      seqStore->sequences->offset = 1;
      if (0xffff < sVar10 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->matchLength = (U16)(sVar10 + 1);
      seqStore->sequences = seqStore->sequences + 1;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2);
}